

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitArraySet(FunctionValidator *this,ArraySet *curr)

{
  bool bVar1;
  Module *pMVar2;
  Type local_70 [2];
  Type *local_60;
  Field *element;
  HeapType local_50;
  HeapType heapType;
  Type local_40;
  Type local_38;
  BasicType local_2c;
  Type local_28;
  Type local_20;
  ArraySet *local_18;
  ArraySet *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArraySet *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::ArraySet*>(this,bVar1,local_18,"array.set requires gc [--enable-gc]");
  local_20.id = (local_18->index->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArraySet*,wasm::Type>
            (this,local_20,local_28,local_18,"array.set index must be an i32");
  local_2c = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)67>).
                      super_Expression.type,&local_2c);
  if (!bVar1) {
    local_38.id = (local_18->ref->type).id;
    HeapType::HeapType(&heapType,array);
    wasm::Type::Type(&local_40,heapType,Nullable);
    bVar1 = shouldBeSubType(this,local_38,local_40,(Expression *)local_18,
                            "array.set target should be an array reference");
    if (bVar1) {
      local_50 = wasm::Type::getHeapType(&local_18->ref->type);
      element._4_4_ = 0xb;
      bVar1 = HeapType::operator==(&local_50,(BasicHeapType *)((long)&element + 4));
      if (!bVar1) {
        element._0_4_ = 6;
        bVar1 = HeapType::operator!=(&local_50,(BasicHeapType *)&element);
        bVar1 = shouldBeTrue<wasm::ArraySet*>
                          (this,bVar1,local_18,
                           "array.set target should be a specific array reference");
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          wasm::Type::getHeapType(&local_18->ref->type);
          HeapType::getArray((HeapType *)local_70);
          local_60 = local_70;
          shouldBeSubType(this,(Type)(local_18->value->type).id,local_70[0],(Expression *)local_18,
                          "array.set must have the proper type");
          shouldBeTrue<wasm::ArraySet*>
                    (this,*(int *)((long)&local_60[1].id + 4) != 0,local_18,
                     "array.set type must be mutable");
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArraySet(ArraySet* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.set requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->index->type, Type(Type::i32), curr, "array.set index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->ref->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.set target should be an array reference")) {
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  if (heapType == HeapType::none) {
    return;
  }
  if (!shouldBeTrue(heapType != HeapType::array,
                    curr,
                    "array.set target should be a specific array reference")) {
    return;
  }
  const auto& element = curr->ref->type.getHeapType().getArray().element;
  shouldBeSubType(curr->value->type,
                  element.type,
                  curr,
                  "array.set must have the proper type");
  shouldBeTrue(element.mutable_, curr, "array.set type must be mutable");
}